

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_construction.hpp
# Opt level: O3

void __thiscall
type_safe::deferred_construction<std::__cxx11::string>::emplace<char_const(&)[4]>
          (deferred_construction<std::__cxx11::string> *this,char (*args) [4])

{
  size_t sVar1;
  source_location local_20;
  
  local_20.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/deferred_construction.hpp"
  ;
  local_20.line_number = 0x6e;
  if (this[0x20] != (deferred_construction<std::__cxx11::string>)0x1) {
    *(deferred_construction<std::__cxx11::string> **)this = this + 0x10;
    sVar1 = strlen(*args);
    std::__cxx11::string::_M_construct<char_const*>((string *)this,args,*args + sVar1);
    this[0x20] = (deferred_construction<std::__cxx11::string>)0x1;
    return;
  }
  debug_assert::default_handler::handle(&local_20,"!has_value()",(char *)0x0);
  abort();
}

Assistant:

void emplace(Args&&... args)
    {
        DEBUG_ASSERT(!has_value(), detail::precondition_error_handler{});
        ::new (as_void()) value_type(std::forward<Args>(args)...);
        initialized_ = true;
    }